

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O2

void fctkern__log_suite_end(fctkern_t *nk,fct_ts_t *ts)

{
  size_t sVar1;
  void *pvVar2;
  size_t idx;
  
  if (nk == (fctkern_t *)0x0) {
    __assert_fail("nk != ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x922
                  ,"void fctkern__log_suite_end(fctkern_t *, const fct_ts_t *)");
  }
  if (ts != (fct_ts_t *)0x0) {
    sVar1 = (nk->logger_list).used_itm_num;
    for (idx = 0; sVar1 != idx; idx = idx + 1) {
      pvVar2 = fct_nlist__at(&nk->logger_list,idx);
      *(fct_ts_t **)((long)pvVar2 + 0x70) = ts;
      (**(code **)((long)pvVar2 + 0x20))(pvVar2,(long)pvVar2 + 0x58);
    }
    return;
  }
  __assert_fail("ts != ((void*)0)",
                "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x923,
                "void fctkern__log_suite_end(fctkern_t *, const fct_ts_t *)");
}

Assistant:

static void
fctkern__log_suite_end(fctkern_t *nk, fct_ts_t const *ts)
{
    FCT_ASSERT( nk != NULL );
    FCT_ASSERT( ts != NULL );
    FCT_NLIST_FOREACH_BGN(fct_logger_i*, logger, &(nk->logger_list))
    {
        fct_logger__on_test_suite_end(logger, ts);
    }
    FCT_NLIST_FOREACH_END();
}